

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  iterator iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  timestamp_t local_90;
  ulong local_88;
  Vector *local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_88 = count + 0x3f >> 6;
      uVar6 = 0;
      uVar7 = 0;
      local_80 = input;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = puVar1[uVar6];
        }
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar5 != 0) {
          uVar9 = uVar7;
          if (uVar5 == 0xffffffffffffffff) {
            if (uVar7 < uVar8) {
              do {
                local_78.sel = *(SelectionVector **)(pdVar2 + uVar7 * 8);
                iVar4._M_current = *(timestamp_t **)(state + 8);
                if (iVar4._M_current == *(timestamp_t **)(state + 0x10)) {
                  ::std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::
                  _M_realloc_insert<duckdb::timestamp_t>
                            ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                             state,iVar4,(timestamp_t *)&local_78);
                }
                else {
                  (iVar4._M_current)->value = (int64_t)local_78.sel;
                  *(timestamp_t **)(state + 8) = iVar4._M_current + 1;
                }
                uVar7 = uVar7 + 1;
                uVar9 = uVar7;
              } while (uVar8 != uVar7);
            }
          }
          else if (uVar7 < uVar8) {
            uVar9 = 0;
            do {
              if ((uVar5 >> (uVar9 & 0x3f) & 1) != 0) {
                local_78.sel = *(SelectionVector **)(pdVar2 + uVar9 * 8 + uVar7 * 8);
                iVar4._M_current = *(timestamp_t **)(state + 8);
                if (iVar4._M_current == *(timestamp_t **)(state + 0x10)) {
                  ::std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::
                  _M_realloc_insert<duckdb::timestamp_t>
                            ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                             state,iVar4,(timestamp_t *)&local_78);
                }
                else {
                  (iVar4._M_current)->value = (int64_t)local_78.sel;
                  *(timestamp_t **)(state + 8) = iVar4._M_current + 1;
                }
              }
              uVar9 = uVar9 + 1;
            } while ((uVar7 - uVar8) + uVar9 != 0);
            input = local_80;
            uVar9 = uVar7 + uVar9;
          }
        }
        uVar6 = uVar6 + 1;
        uVar7 = uVar9;
      } while (uVar6 != local_88);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      QuantileOperation::
      ConstantOperation<duckdb::timestamp_t,duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>>
                ((QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> *)state,
                 (timestamp_t *)input->data,(AggregateUnaryInput *)&local_78,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_78.sel)->sel_vector;
        uVar7 = 0;
        do {
          uVar6 = uVar7;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar7];
          }
          local_90.value = *(int64_t *)(local_78.data + uVar6 * 8);
          iVar4._M_current = *(timestamp_t **)(state + 8);
          if (iVar4._M_current == *(timestamp_t **)(state + 0x10)) {
            ::std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::
            _M_realloc_insert<duckdb::timestamp_t>
                      ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)state,
                       iVar4,&local_90);
          }
          else {
            (iVar4._M_current)->value = local_90.value;
            *(timestamp_t **)(state + 8) = iVar4._M_current + 1;
          }
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
      }
    }
    else if (count != 0) {
      psVar3 = (local_78.sel)->sel_vector;
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar7];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
             >> (uVar6 & 0x3f) & 1) != 0)) {
          local_90.value = *(int64_t *)(local_78.data + uVar6 * 8);
          iVar4._M_current = *(timestamp_t **)(state + 8);
          if (iVar4._M_current == *(timestamp_t **)(state + 0x10)) {
            ::std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::
            _M_realloc_insert<duckdb::timestamp_t>
                      ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)state,
                       iVar4,&local_90);
          }
          else {
            (iVar4._M_current)->value = local_90.value;
            *(timestamp_t **)(state + 8) = iVar4._M_current + 1;
          }
        }
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}